

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

size_t aead_do_decrypt(ptls_aead_context_t *_ctx,void *_output,void *input,size_t inlen,uint64_t seq
                      ,void *aad,size_t aadlen)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  uint8_t iv [32];
  int local_5c;
  uint8_t local_58 [40];
  
  uVar1 = _ctx->algo->tag_size;
  sVar3 = 0xffffffffffffffff;
  if (uVar1 <= inlen) {
    ptls_aead__build_iv(_ctx->algo,local_58,(uint8_t *)&_ctx[1].dispose_crypto,seq);
    iVar2 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                               (uchar *)0x0,local_58);
    if (iVar2 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                    0x54f,
                    "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, uint64_t, const void *, size_t)"
                   );
    }
    if (aadlen != 0) {
      iVar2 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)0x0,&local_5c,(uchar *)aad,
                                (int)aadlen);
      if (iVar2 == 0) {
        __assert_fail("ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c"
                      ,0x552,
                      "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, uint64_t, const void *, size_t)"
                     );
      }
    }
    iVar2 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)_output,&local_5c,
                              (uchar *)input,(int)inlen - (int)uVar1);
    if (iVar2 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                    0x555,
                    "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, uint64_t, const void *, size_t)"
                   );
    }
    lVar4 = (long)local_5c;
    iVar2 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)_ctx[1].algo,0x11,(int)uVar1,
                                (void *)((long)input + (inlen - uVar1)));
    if (iVar2 == 0) {
      sVar3 = 0xffffffffffffffff;
    }
    else {
      iVar2 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)((long)_output + lVar4),
                                  &local_5c);
      sVar3 = 0xffffffffffffffff;
      if (iVar2 != 0) {
        sVar3 = local_5c + lVar4;
      }
    }
  }
  return sVar3;
}

Assistant:

static size_t aead_do_decrypt(ptls_aead_context_t *_ctx, void *_output, const void *input, size_t inlen, uint64_t seq,
                              const void *aad, size_t aadlen)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output, iv[PTLS_MAX_IV_SIZE];
    size_t off = 0, tag_size = ctx->super.algo->tag_size;
    int blocklen, ret;

    if (inlen < tag_size)
        return SIZE_MAX;

    ptls_aead__build_iv(ctx->super.algo, iv, ctx->static_iv, seq);
    ret = EVP_DecryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv);
    assert(ret);
    if (aadlen != 0) {
        ret = EVP_DecryptUpdate(ctx->evp_ctx, NULL, &blocklen, aad, (int)aadlen);
        assert(ret);
    }
    ret = EVP_DecryptUpdate(ctx->evp_ctx, output + off, &blocklen, input, (int)(inlen - tag_size));
    assert(ret);
    off += blocklen;
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_SET_TAG, (int)tag_size, (void *)((uint8_t *)input + inlen - tag_size)))
        return SIZE_MAX;
    if (!EVP_DecryptFinal_ex(ctx->evp_ctx, output + off, &blocklen))
        return SIZE_MAX;
    off += blocklen;

    return off;
}